

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O1

exr_result_t validate_image_dimensions(exr_context_t f,exr_priv_part_t curpart)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  exr_result_t eVar8;
  ulong uVar9;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  
  uVar2 = (curpart->display_window).min.x;
  uVar3 = (curpart->display_window).min.y;
  uVar11 = (ulong)uVar3;
  uVar4 = (curpart->display_window).max.x;
  uVar12 = (ulong)uVar4;
  iVar14 = (curpart->display_window).max.y;
  if (((int)uVar4 < (int)uVar2) ||
     (0x3ffffffe < iVar14 ||
      ((0x3ffffffe < (int)uVar4 || iVar14 < (int)uVar3) ||
      ((int)uVar3 < -0x3ffffffe || (int)uVar2 < -0x3ffffffe)))) {
    pcVar10 = "Invalid display window (%d, %d - %d, %d)";
  }
  else {
    uVar2 = (curpart->data_window).min.x;
    iVar5 = (curpart->data_window).min.y;
    uVar11 = (ulong)iVar5;
    iVar6 = (curpart->data_window).max.x;
    uVar12 = (ulong)iVar6;
    iVar14 = (curpart->data_window).max.y;
    if (((int)uVar2 <= iVar6) &&
       (iVar14 < 0x3fffffff &&
        ((iVar6 < 0x3fffffff && iVar5 <= iVar14) &&
        (-0x3fffffff < iVar5 && -0x3fffffff < (int)uVar2)))) {
      uVar3 = f->max_image_w;
      uVar9 = (ulong)uVar3;
      if ((long)uVar9 <= (long)(uVar12 - (long)(int)uVar2) && 0 < (int)uVar3) {
        eVar8 = (*f->print_error)(f,0xe,"Invalid width (%ld) too large (max %d)",
                                  (uVar12 - (long)(int)uVar2) + 1,uVar9);
        return eVar8;
      }
      uVar4 = f->max_image_h;
      uVar12 = (ulong)uVar4;
      if ((long)((long)iVar14 - uVar11) < (long)uVar12 || (int)uVar4 < 1) {
        fVar7 = (curpart->pixelAspectRatio->field_6).f;
        fVar1 = (curpart->screenWindowWidth->field_6).f;
        if (0 < (int)uVar3 && 0 < (int)uVar4) {
          if (curpart->chunkCount == (exr_attribute_t *)0x0) {
            lVar13 = 0;
          }
          else {
            lVar13 = (long)curpart->chunk_count;
          }
          if ((long)(uVar12 * uVar9) < lVar13) {
            eVar8 = (*f->print_error)(f,0xe,"Invalid chunkCount (%ld) exceeds maximum area of %ld",
                                      lVar13,uVar12 * uVar9);
            return eVar8;
          }
        }
        if (((0x7effffff < (int)ABS(fVar7) - 0x800000U) || (fVar7 < 1e-06)) || (1e+06 < fVar7)) {
          UNRECOVERED_JUMPTABLE = f->print_error;
          pcVar10 = "Invalid pixel aspect ratio %g";
        }
        else {
          if (0.0 <= fVar1) {
            return 0;
          }
          UNRECOVERED_JUMPTABLE = f->print_error;
          pcVar10 = "Invalid screen window width %g";
          fVar7 = fVar1;
        }
        eVar8 = (*UNRECOVERED_JUMPTABLE)(f,0xe,pcVar10,(double)fVar7,UNRECOVERED_JUMPTABLE);
        return eVar8;
      }
      eVar8 = (*f->print_error)(f,0xe,"Invalid height (%ld) too large (max %d)",
                                ((long)iVar14 - uVar11) + 1,uVar12,f->print_error);
      return eVar8;
    }
    pcVar10 = "Invalid data window (%d, %d - %d, %d)";
  }
  eVar8 = (*f->print_error)(f,0xe,pcVar10,(ulong)uVar2,uVar11,uVar12,iVar14);
  return eVar8;
}

Assistant:

static exr_result_t
validate_image_dimensions (exr_context_t f, exr_priv_part_t curpart)
{
    // sanity check the various parts...
    const int64_t          kLargeVal = (int64_t) (INT32_MAX / 2);
    const exr_attr_box2i_t dw        = curpart->data_window;
    const exr_attr_box2i_t dspw      = curpart->display_window;
    int64_t                w, h;
    float                  par, sww;
    int                    maxw = f->max_image_w;
    int                    maxh = f->max_image_h;

    par = curpart->pixelAspectRatio->f;
    sww = curpart->screenWindowWidth->f;

    w = (int64_t) dw.max.x - (int64_t) dw.min.x + 1;
    h = (int64_t) dw.max.y - (int64_t) dw.min.y + 1;

    if (dspw.min.x > dspw.max.x || dspw.min.y > dspw.max.y ||
        dspw.min.x <= -kLargeVal || dspw.min.y <= -kLargeVal ||
        dspw.max.x >= kLargeVal || dspw.max.y >= kLargeVal)
        return f->print_error (
            f,
            EXR_ERR_INVALID_ATTR,
            "Invalid display window (%d, %d - %d, %d)",
            dspw.min.x,
            dspw.min.y,
            dspw.max.x,
            dspw.max.y);

    if (dw.min.x > dw.max.x || dw.min.y > dw.max.y || dw.min.x <= -kLargeVal ||
        dw.min.y <= -kLargeVal || dw.max.x >= kLargeVal ||
        dw.max.y >= kLargeVal)
        return f->print_error (
            f,
            EXR_ERR_INVALID_ATTR,
            "Invalid data window (%d, %d - %d, %d)",
            dw.min.x,
            dw.min.y,
            dw.max.x,
            dw.max.y);

    if (maxw > 0 && maxw < w)
        return f->print_error (
            f,
            EXR_ERR_INVALID_ATTR,
            "Invalid width (%" PRId64 ") too large (max %d)",
            w,
            maxw);

    if (maxh > 0 && maxh < h)
        return f->print_error (
            f,
            EXR_ERR_INVALID_ATTR,
            "Invalid height (%" PRId64 ") too large (max %d)",
            h,
            maxh);

    if (maxw > 0 && maxh > 0)
    {
        int64_t maxNum = (int64_t) maxw * (int64_t) maxh;
        int64_t ccount = 0;
        if (curpart->chunkCount) ccount = (int64_t) curpart->chunk_count;
        if (ccount > maxNum)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Invalid chunkCount (%" PRId64
                ") exceeds maximum area of %" PRId64 "",
                ccount,
                maxNum);
    }

    /* isnormal will return true when par is 0, which should also be disallowed */
    if (!isnormal (par) || par < 1e-6f || par > 1e+6f)
        return f->print_error (
            f,
            EXR_ERR_INVALID_ATTR,
            "Invalid pixel aspect ratio %g",
            (double) par);

    if (sww < 0.f)
        return f->print_error (
            f,
            EXR_ERR_INVALID_ATTR,
            "Invalid screen window width %g",
            (double) sww);

    return EXR_ERR_SUCCESS;
}